

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

string * __thiscall
deqp::gls::ShaderExecUtil::TessControlExecutor::generateTessControlShader_abi_cxx11_
          (string *__return_storage_ptr__,TessControlExecutor *this,ShaderSpec *shaderSpec)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  int ndx;
  int iVar4;
  ostringstream src;
  ostream oStack_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_1a8);
  pcVar2 = glu::getGLSLVersionDeclaration
                     (*(GLSLVersion *)
                       &(this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor);
  poVar3 = std::operator<<(&oStack_1a8,pcVar2);
  std::operator<<(poVar3,"\n");
  bVar1 = glu::glslVersionIsES
                    (*(GLSLVersion *)
                      &(this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor);
  if (bVar1 && *(int *)&(this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor < 3
     ) {
    std::operator<<(&oStack_1a8,"#extension GL_EXT_tessellation_shader : require\n");
  }
  if ((this->super_BufferIoExecutor).m_program.m_shaders[0].
      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    poVar3 = std::operator<<(&oStack_1a8,
                             (string *)
                             &(this->super_BufferIoExecutor).super_ShaderExecutor.m_outputs.
                              super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar3,"\n");
  }
  std::operator<<(&oStack_1a8,"\nlayout(vertices = 1) out;\n\n");
  BufferIoExecutor::declareBufferBlocks(&oStack_1a8,(ShaderSpec *)this);
  std::operator<<(&oStack_1a8,"void main (void)\n{\n");
  for (iVar4 = 0; iVar4 != 2; iVar4 = iVar4 + 1) {
    poVar3 = std::operator<<(&oStack_1a8,"\tgl_TessLevelInner[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
    std::operator<<(poVar3,"] = 1.0;\n");
  }
  for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
    poVar3 = std::operator<<(&oStack_1a8,"\tgl_TessLevelOuter[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
    std::operator<<(poVar3,"] = 1.0;\n");
  }
  poVar3 = std::operator<<(&oStack_1a8,"\n");
  std::operator<<(poVar3,"\thighp uint invocationId = uint(gl_PrimitiveID);\n");
  BufferIoExecutor::generateExecBufferIo(&oStack_1a8,(ShaderSpec *)this,"invocationId");
  std::operator<<(&oStack_1a8,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string TessControlExecutor::generateTessControlShader (const ShaderSpec& shaderSpec)
{
	std::ostringstream src;

	src << glu::getGLSLVersionDeclaration(shaderSpec.version) << "\n";

	if (glu::glslVersionIsES(shaderSpec.version) && shaderSpec.version <= glu::GLSL_VERSION_310_ES)
		src << "#extension GL_EXT_tessellation_shader : require\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	src << "\nlayout(vertices = 1) out;\n\n";

	declareBufferBlocks(src, shaderSpec);

	src << "void main (void)\n{\n";

	for (int ndx = 0; ndx < 2; ndx++)
		src << "\tgl_TessLevelInner[" << ndx << "] = 1.0;\n";

	for (int ndx = 0; ndx < 4; ndx++)
		src << "\tgl_TessLevelOuter[" << ndx << "] = 1.0;\n";

	src << "\n"
		<< "\thighp uint invocationId = uint(gl_PrimitiveID);\n";

	generateExecBufferIo(src, shaderSpec, "invocationId");

	src << "}\n";

	return src.str();
}